

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

int Kit_TruthVarIsVacuous(uint *pOnset,uint *pOffset,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint *puVar5;
  ulong uVar6;
  int iVar7;
  uint *puVar8;
  int iVar9;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  uVar6 = (ulong)uVar1;
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pOnset[uVar3] >> 1 & pOffset[uVar3] | pOffset[uVar3] >> 1 & pOnset[uVar3]) &
              0x55555555) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      break;
    case 1:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pOnset[uVar3] >> 2 & pOffset[uVar3] | pOffset[uVar3] >> 2 & pOnset[uVar3]) &
              0x33333333) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      break;
    case 2:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pOnset[uVar3] >> 4 & pOffset[uVar3] | pOffset[uVar3] >> 4 & pOnset[uVar3]) &
              0xf0f0f0f) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      break;
    case 3:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pOnset[uVar3] >> 8 & pOffset[uVar3] | pOffset[uVar3] >> 8 & pOnset[uVar3]) &
              0xff00ff) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      break;
    case 4:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if ((pOnset[uVar3] >> 0x10 & pOffset[uVar3]) != 0 ||
              (pOffset[uVar3] >> 0x10 & pOnset[uVar3]) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      break;
    default:
      if (0 < (int)uVar1) {
        bVar4 = (byte)(iVar + -5);
        uVar2 = 1 << (bVar4 & 0x1f);
        iVar7 = 2 << (bVar4 & 0x1f);
        uVar6 = 1;
        if (1 < (int)uVar2) {
          uVar6 = (ulong)uVar2;
        }
        puVar8 = pOffset + (int)uVar2;
        puVar5 = pOnset + (int)uVar2;
        iVar9 = 0;
        do {
          if (iVar + -5 != 0x1f) {
            uVar3 = 0;
            do {
              if ((puVar5[uVar3] & pOffset[uVar3]) != 0 || (puVar8[uVar3] & pOnset[uVar3]) != 0) {
                return 0;
              }
              uVar3 = uVar3 + 1;
            } while (uVar6 != uVar3);
          }
          iVar9 = iVar9 + iVar7;
          puVar8 = puVar8 + iVar7;
          puVar5 = puVar5 + iVar7;
          pOffset = pOffset + iVar7;
          pOnset = pOnset + iVar7;
        } while (iVar9 < (int)uVar1);
      }
    }
    return 1;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                ,0x276,"int Kit_TruthVarIsVacuous(unsigned int *, unsigned int *, int, int)");
}

Assistant:

int Kit_TruthVarIsVacuous( unsigned * pOnset, unsigned * pOffset, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 1)) | (pOffset[i] & (pOnset[i] >> 1))) & 0x55555555 )
                 return 0;
        return 1;
    case 1:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 2)) | (pOffset[i] & (pOnset[i] >> 2))) & 0x33333333 )
                 return 0;
            return 1;
    case 2:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 4)) | (pOffset[i] & (pOnset[i] >> 4))) & 0x0F0F0F0F )
                 return 0;
        return 1;
    case 3:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 8)) | (pOffset[i] & (pOnset[i] >> 8))) & 0x00FF00FF )
                 return 0;
        return 1;
    case 4:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 16)) | (pOffset[i] & (pOnset[i] >> 16))) & 0x0000FFFF )
                 return 0;
        return 1;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( (pOnset[i] & pOffset[Step+i]) | (pOffset[i] & pOnset[Step+i]) )
                     return 0;
            pOnset += 2*Step;
            pOffset += 2*Step;
        }
        return 1;
    }
}